

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::expandFromI1(Graph *this,Node *node,Expression *origin)

{
  bool bVar1;
  Node *pNVar2;
  
  if (node->type != Bad) {
    bVar1 = Node::returnsI1(node);
    if (bVar1) {
      pNVar2 = Node::makeZext(node,origin);
      pNVar2 = addNode(this,pNVar2);
      return pNVar2;
    }
  }
  return node;
}

Assistant:

Node* expandFromI1(Node* node, Expression* origin) {
    if (!node->isBad() && node->returnsI1()) {
      node = addNode(Node::makeZext(node, origin));
    }
    return node;
  }